

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv_udp_set_broadcast(uv_udp_t *handle,int on)

{
  int iVar1;
  int *piVar2;
  int local_1c;
  uv_udp_t *puStack_18;
  int on_local;
  uv_udp_t *handle_local;
  
  local_1c = on;
  puStack_18 = handle;
  iVar1 = setsockopt((handle->io_watcher).fd,1,6,&local_1c,4);
  if (iVar1 == 0) {
    handle_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    handle_local._4_4_ = -*piVar2;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_udp_set_broadcast(uv_udp_t* handle, int on) {
  if (setsockopt(handle->io_watcher.fd,
                 SOL_SOCKET,
                 SO_BROADCAST,
                 &on,
                 sizeof(on))) {
    return UV__ERR(errno);
  }

  return 0;
}